

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O1

void group_create(group_t *g,bsp_pid_t members)

{
  bsp_pid_t bVar1;
  bsp_pid_t *pbVar2;
  bsp_pid_t *pbVar3;
  bsp_size_t *pbVar4;
  
  g->size = members;
  bVar1 = bsp_nprocs();
  pbVar2 = (bsp_pid_t *)calloc((long)bVar1,4);
  g->lid = pbVar2;
  pbVar3 = (bsp_pid_t *)calloc((long)members,4);
  g->gid = pbVar3;
  pbVar4 = (bsp_size_t *)calloc((long)members,4);
  g->rof = pbVar4;
  if (((pbVar3 != (bsp_pid_t *)0x0) && (pbVar2 != (bsp_pid_t *)0x0)) &&
     (pbVar4 != (bsp_size_t *)0x0)) {
    return;
  }
  bsp_abort("bsc: insufficient memory for creating process group\n");
  return;
}

Assistant:

static void group_create( group_t * g , bsp_pid_t members )
{
    g->size = members;
    g->lid = calloc( bsp_nprocs(), sizeof(g->lid[0]));
    g->gid = calloc( members, sizeof(g->gid[0]));
    g->rof = calloc( members, sizeof(g->rof[0]));
    if (!g->lid || !g->rof || !g->gid )
        bsp_abort("bsc: insufficient memory for creating process group\n");
}